

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_triangles_to_quads(Ref<embree::SceneGraph::TriangleMeshNode> *tmesh)

{
  ulong uVar1;
  bool bVar2;
  _func_int **pp_Var3;
  size_type sVar4;
  reference pvVar5;
  size_type sVar6;
  long *in_RSI;
  Node *in_RDI;
  int a3;
  pair<int,_int> q;
  int b2;
  int b1;
  int b0;
  int a2;
  int a1;
  int a0;
  size_t i;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  iterator __end1;
  iterator __begin1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range1;
  Ref<embree::SceneGraph::QuadMeshNode> qmesh;
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *in_stack_fffffffffffffca0;
  value_type *in_stack_fffffffffffffca8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffffcb0;
  size_t in_stack_fffffffffffffd28;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffd30;
  QuadMeshNode *in_stack_fffffffffffffd38;
  BBox1f in_stack_fffffffffffffd40;
  Quad local_1fc;
  Quad local_1ec;
  Quad local_1dc;
  Quad local_1cc;
  Quad local_1bc;
  uint local_1ac;
  pair<int,_int> local_1a8;
  uint local_1a0;
  uint local_19c;
  uint local_198;
  Quad local_194;
  uint local_184;
  uint local_180;
  uint local_17c;
  ulong local_178;
  reference local_170;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_168;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_160;
  long local_158;
  undefined1 local_149;
  undefined8 local_148;
  long *local_130;
  _func_int **local_128 [16];
  _func_int ***local_a8;
  _func_int ***local_a0;
  _func_int ***local_98;
  _func_int ***local_90;
  _func_int ***local_88;
  _func_int ***local_80;
  _func_int ***local_78;
  _func_int ***local_70;
  _func_int ***local_68;
  _func_int ***local_60;
  long *local_50;
  long **local_48;
  _func_int **local_40;
  _func_int ***local_38;
  long **local_30;
  _func_int ***local_20;
  _func_int **local_10;
  
  pp_Var3 = (_func_int **)::operator_new(0xd8);
  local_149 = 1;
  local_50 = (long *)(*in_RSI + 0xd0);
  local_48 = &local_130;
  local_130 = (long *)*local_50;
  if (local_130 != (long *)0x0) {
    (**(code **)(*local_130 + 0x10))();
  }
  local_148 = *(undefined8 *)(*in_RSI + 0x68);
  QuadMeshNode::QuadMeshNode
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd28);
  local_149 = 0;
  local_38 = local_128;
  local_40 = pp_Var3;
  local_128[0] = pp_Var3;
  if (pp_Var3 != (_func_int **)0x0) {
    (**(code **)(*pp_Var3 + 0x10))();
  }
  local_30 = &local_130;
  if (local_130 != (long *)0x0) {
    (**(code **)(*local_130 + 0x18))();
  }
  local_158 = *in_RSI + 0x70;
  local_160._M_current =
       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ::begin((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_168 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                             *)in_stack_fffffffffffffca0,
                            (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)), bVar2
        ) {
    local_170 = __gnu_cxx::
                __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                ::operator*(&local_160);
    local_68 = local_128;
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    __gnu_cxx::
    __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
    ::operator++(&local_160);
  }
  local_70 = local_128;
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::operator=((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               *)in_stack_fffffffffffffd40,
              (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               *)in_stack_fffffffffffffd38);
  local_78 = local_128;
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffffd40,
             (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffffd38);
  for (local_178 = 0; uVar1 = local_178,
      sVar4 = std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ::size((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                      *)(*in_RSI + 0xb8)), uVar1 < sVar4; local_178 = local_178 + 1) {
    pvVar5 = std::
             vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
             ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           *)(*in_RSI + 0xb8),local_178);
    local_17c = pvVar5->v0;
    pvVar5 = std::
             vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
             ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           *)(*in_RSI + 0xb8),local_178);
    local_180 = pvVar5->v1;
    pvVar5 = std::
             vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
             ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           *)(*in_RSI + 0xb8),local_178);
    local_184 = pvVar5->v2;
    sVar6 = local_178 + 1;
    sVar4 = std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::size((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                    *)(*in_RSI + 0xb8));
    if (sVar6 == sVar4) {
      local_80 = local_128;
      QuadMeshNode::Quad::Quad(&local_194,local_17c,local_180,local_184,local_184);
      std::
      vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
      ::push_back(in_stack_fffffffffffffca0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    }
    else {
      pvVar5 = std::
               vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(*in_RSI + 0xb8),local_178 + 1);
      local_198 = pvVar5->v0;
      pvVar5 = std::
               vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(*in_RSI + 0xb8),local_178 + 1);
      local_19c = pvVar5->v1;
      pvVar5 = std::
               vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(*in_RSI + 0xb8),local_178 + 1);
      local_1a0 = pvVar5->v2;
      local_1a8 = quad_index3((int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                              (int)in_stack_fffffffffffffca8,
                              (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                              (int)in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,
                              in_stack_fffffffffffffc98);
      local_1ac = local_1a8.second;
      if (local_1a8.second == 0xffffffff) {
        local_88 = local_128;
        QuadMeshNode::Quad::Quad(&local_1bc,local_17c,local_180,local_184,local_184);
        std::
        vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
        ::push_back(in_stack_fffffffffffffca0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      }
      else {
        if (local_1a8.first == -1) {
          local_90 = local_128;
          QuadMeshNode::Quad::Quad(&local_1cc,local_180,local_184,local_1a8.second,local_17c);
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::push_back(in_stack_fffffffffffffca0,
                      (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        }
        else if (local_1a8.first == 0) {
          local_98 = local_128;
          QuadMeshNode::Quad::Quad(&local_1dc,local_1a8.second,local_180,local_184,local_17c);
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::push_back(in_stack_fffffffffffffca0,
                      (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        }
        else if (local_1a8.first == 1) {
          local_a0 = local_128;
          QuadMeshNode::Quad::Quad(&local_1ec,local_17c,local_180,local_1a8.second,local_184);
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::push_back(in_stack_fffffffffffffca0,
                      (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        }
        else if (local_1a8.first == 2) {
          local_a8 = local_128;
          QuadMeshNode::Quad::Quad(&local_1fc,local_180,local_184,local_1a8.second,local_17c);
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::push_back(in_stack_fffffffffffffca0,
                      (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        }
        local_178 = local_178 + 1;
      }
    }
  }
  local_20 = local_128;
  local_10 = local_128[0];
  (in_RDI->super_RefCount)._vptr_RefCount = local_128[0];
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_60 = local_128;
  if (local_128[0] != (_func_int **)0x0) {
    (**(code **)(*local_128[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_triangles_to_quads ( Ref<SceneGraph::TriangleMeshNode> tmesh )
  {
    Ref<SceneGraph::QuadMeshNode> qmesh = new SceneGraph::QuadMeshNode(tmesh->material,tmesh->time_range,0);

    for (auto& p : tmesh->positions)
      qmesh->positions.push_back(p);
    
    qmesh->normals = tmesh->normals;
    qmesh->texcoords = tmesh->texcoords;
    
    for (size_t i=0; i<tmesh->triangles.size(); i++)
    {
      const int a0 = tmesh->triangles[i+0].v0;
      const int a1 = tmesh->triangles[i+0].v1;
      const int a2 = tmesh->triangles[i+0].v2;
      if (i+1 == tmesh->triangles.size()) {
        qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a2));
        continue;
      }
      
      const int b0 = tmesh->triangles[i+1].v0;
      const int b1 = tmesh->triangles[i+1].v1;
      const int b2 = tmesh->triangles[i+1].v2;
      const std::pair<int,int> q = quad_index3(a0,a1,a2,b0,b1,b2);
      const int a3 = q.second;
      if (a3 == -1) {
        qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a2));
        continue;
      }
      
      if      (q.first == -1) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a1,a2,a3,a0));
      else if (q.first ==  0) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a3,a1,a2,a0));
      else if (q.first ==  1) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a3,a2));
      else if (q.first ==  2) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a1,a2,a3,a0)); 
      i++;
    }
    return qmesh.dynamicCast<SceneGraph::Node>();
  }